

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintSmartPointer<unsigned_char[],std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *ptr,ostream *os,
               char param_3)

{
  bool bVar1;
  ostream *poVar2;
  pointer p;
  void *pvVar3;
  ostream *in_RSI;
  nullptr_t in_stack_ffffffffffffffd8;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::operator<<(in_RSI,"(nullptr)");
  }
  else {
    poVar2 = std::operator<<(in_RSI,"(");
    p = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)poVar2);
    pvVar3 = VoidifyPointer(p);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar3);
    std::operator<<(poVar2,")");
  }
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, char) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    // We can't print the value. Just print the pointer..
    *os << "(" << (VoidifyPointer)(ptr.get()) << ")";
  }
}